

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall
IRTreeBuildVisitor::IRTreeBuildVisitor(IRTreeBuildVisitor *this,NewScopeLayerTree *tree)

{
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).super_Visitor._vptr_Visitor =
       (_func_int **)&PTR_Visit_00161610;
  (this->current_classname_)._M_dataplus._M_p = (pointer)&(this->current_classname_).field_2;
  (this->current_classname_)._M_string_length = 0;
  (this->current_classname_).field_2._M_local_buf[0] = '\0';
  this->tree_ = tree;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&this->offsets_);
  (this->frame_translator_)._M_h._M_buckets = &(this->frame_translator_)._M_h._M_single_bucket;
  (this->frame_translator_)._M_h._M_bucket_count = 1;
  (this->frame_translator_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->frame_translator_)._M_h._M_element_count = 0;
  (this->frame_translator_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->frame_translator_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->frame_translator_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->method_trees_)._M_h._M_buckets = &(this->method_trees_)._M_h._M_single_bucket;
  (this->method_trees_)._M_h._M_bucket_count = 1;
  (this->method_trees_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->method_trees_)._M_h._M_element_count = 0;
  (this->method_trees_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->method_trees_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->method_trees_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  NewScopeLayer::PrepareTraversing(this->tree_->root_);
  this->current_layer_ = this->tree_->root_;
  this->current_frame_ = (FrameTranslator *)0x0;
  return;
}

Assistant:

IRTreeBuildVisitor::IRTreeBuildVisitor(NewScopeLayerTree* tree) : tree_(tree) {
  tree_->root_->PrepareTraversing();
  current_layer_ = tree_->root_;
  current_frame_ = nullptr;
}